

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.2.4.11.h
# Opt level: O3

Result * __thiscall
doctest::detail::Expression_lhs::operator_cast_to_Result
          (Result *__return_storage_ptr__,Expression_lhs *this)

{
  Expression_lhs EVar1;
  long lVar2;
  ContextOptions *pCVar3;
  ostream *stream;
  String SStack_38;
  
  lVar2 = *(long *)this;
  EVar1 = this[9];
  if ((lVar2 != 0) != (bool)((byte)EVar1 & 1)) {
    pCVar3 = getContextOptions();
    if (pCVar3->success != true) {
      String::String(&SStack_38);
      Result::Result(__return_storage_ptr__,true,&SStack_38);
      goto LAB_00164310;
    }
  }
  stream = tlssPush();
  filldata<const_void_*>::fill(stream,*(void **)this);
  tlssPop();
  Result::Result(__return_storage_ptr__,(bool)((lVar2 != 0 ^ (byte)EVar1) & 1),&SStack_38);
LAB_00164310:
  String::~String(&SStack_38);
  return __return_storage_ptr__;
}

Assistant:

DOCTEST_NOINLINE operator Result() {
// this is needed only for MSVC 2015
DOCTEST_MSVC_SUPPRESS_WARNING_WITH_PUSH(4800) // 'int': forcing value to bool
            bool res = static_cast<bool>(lhs);
DOCTEST_MSVC_SUPPRESS_WARNING_POP
            if(m_at & assertType::is_false) { //!OCLINT bitwise operator in conditional
                res = !res;
            }

            if(!res || getContextOptions()->success) {
                return { res, (DOCTEST_STRINGIFY(lhs)) };
            }
            return { res };
        }